

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O0

void Sat_MemAlloc_(Sat_Mem_t *p,int nPageSize)

{
  int **ppiVar1;
  int *piVar2;
  int nPageSize_local;
  Sat_Mem_t *p_local;
  
  if ((8 < nPageSize) && (nPageSize < 0x20)) {
    memset(p,0,0x38);
    p->nPageSize = nPageSize;
    p->uLearnedMask = 1 << ((byte)nPageSize & 0x1f);
    p->uPageMask = (1 << ((byte)nPageSize & 0x1f)) - 1;
    p->nPagesAlloc = 0x100;
    ppiVar1 = (int **)calloc((long)p->nPagesAlloc,8);
    p->pPages = ppiVar1;
    piVar2 = (int *)malloc((long)(int)(1L << ((byte)p->nPageSize & 0x3f)) << 2);
    *p->pPages = piVar2;
    piVar2 = (int *)malloc((long)(int)(1L << ((byte)p->nPageSize & 0x3f)) << 2);
    p->pPages[1] = piVar2;
    p->iPage[0] = 0;
    p->iPage[1] = 1;
    Sat_MemWriteLimit(*p->pPages,2);
    Sat_MemWriteLimit(p->pPages[1],2);
    return;
  }
  __assert_fail("nPageSize > 8 && nPageSize < 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                ,0xc4,"void Sat_MemAlloc_(Sat_Mem_t *, int)");
}

Assistant:

static inline void Sat_MemAlloc_( Sat_Mem_t * p, int nPageSize )
{
    assert( nPageSize > 8 && nPageSize < 32 );
    memset( p, 0, sizeof(Sat_Mem_t) );
    p->nPageSize    = nPageSize;
    p->uLearnedMask = (unsigned)(1 << nPageSize);
    p->uPageMask    = (unsigned)((1 << nPageSize) - 1);
    p->nPagesAlloc  = 256;
    p->pPages       = ABC_CALLOC( int *, p->nPagesAlloc );
    p->pPages[0]    = ABC_ALLOC( int, (int)(((word)1) << p->nPageSize) );
    p->pPages[1]    = ABC_ALLOC( int, (int)(((word)1) << p->nPageSize) );
    p->iPage[0]     = 0;
    p->iPage[1]     = 1;
    Sat_MemWriteLimit( p->pPages[0], 2 );
    Sat_MemWriteLimit( p->pPages[1], 2 );
}